

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

char * funcnamefromcall(lua_State *L,CallInfo *ci,char **name)

{
  uint uVar1;
  Proto *p;
  Instruction *pIVar2;
  char *pcVar3;
  int iVar4;
  
  uVar1 = ci->callstatus;
  if ((uVar1 >> 0x14 & 1) != 0) {
    *name = "?";
    return "hook";
  }
  if ((uVar1 >> 0x18 & 1) == 0) {
    if ((short)uVar1 < 0) {
      return (char *)0x0;
    }
    p = *(Proto **)((((ci->func).p)->val).value_.f + 0x18);
    pIVar2 = p->code;
    iVar4 = (int)((ulong)((long)(ci->u).l.savedpc - (long)pIVar2) >> 2);
    uVar1 = pIVar2[(long)iVar4 + -1];
    pcVar3 = (char *)0x0;
    switch(uVar1 & 0x7f) {
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0x14:
      break;
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
      pcVar3 = (char *)0x1;
      break;
    default:
      goto switchD_0010a75d_caseD_13;
    case 0x2e:
    case 0x2f:
    case 0x30:
      pcVar3 = (char *)(ulong)(uVar1 >> 0x18);
      break;
    case 0x31:
      pcVar3 = (char *)0x12;
      break;
    case 0x32:
      pcVar3 = (char *)0x13;
      break;
    case 0x34:
      pcVar3 = (char *)0x4;
      break;
    case 0x35:
      pcVar3 = (char *)0x16;
      break;
    case 0x36:
    case 0x46:
      pcVar3 = (char *)0x18;
      break;
    case 0x39:
      pcVar3 = (char *)0x5;
      break;
    case 0x3a:
    case 0x3e:
    case 0x40:
      pcVar3 = (char *)0x14;
      break;
    case 0x3b:
    case 0x3f:
    case 0x41:
      pcVar3 = (char *)0x15;
      break;
    case 0x44:
    case 0x45:
      pcVar3 = getobjname(p,iVar4 + -1,uVar1 >> 7 & 0xff,name);
      return pcVar3;
    case 0x4c:
      *name = "for iterator";
      return "for iterator";
    }
    pcVar3 = (char *)((long)&L->l_G->tmname[(long)pcVar3]->contents + 2);
  }
  else {
    pcVar3 = "__gc";
  }
  *name = pcVar3;
  pcVar3 = "metamethod";
switchD_0010a75d_caseD_13:
  return pcVar3;
}

Assistant:

static const char *funcnamefromcall (lua_State *L, CallInfo *ci,
                                                   const char **name) {
  if (ci->callstatus & CIST_HOOKED) {  /* was it called inside a hook? */
    *name = "?";
    return "hook";
  }
  else if (ci->callstatus & CIST_FIN) {  /* was it called as a finalizer? */
    *name = "__gc";
    return "metamethod";  /* report it as such */
  }
  else if (isLua(ci))
    return funcnamefromcode(L, ci_func(ci)->p, currentpc(ci), name);
  else
    return NULL;
}